

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

bool __thiscall cmCTestGIT::UpdateInternal(cmCTestGIT *this)

{
  cmCTest *this_00;
  ulong uVar1;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string custom;
  cmCTestGIT *this_local;
  
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  custom.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"GITUpdateCustom",&local_59);
  cmCTest::GetCTestConfiguration((string *)local_38,this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = UpdateByCustom(this,(string *)local_38);
  }
  else {
    this_local._7_1_ = UpdateByFetchAndReset(this);
  }
  std::__cxx11::string::~string((string *)local_38);
  return this_local._7_1_;
}

Assistant:

bool cmCTestGIT::UpdateInternal()
{
  std::string custom = this->CTest->GetCTestConfiguration("GITUpdateCustom");
  if (!custom.empty()) {
    return this->UpdateByCustom(custom);
  }
  return this->UpdateByFetchAndReset();
}